

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O0

void bsClose(BitStream *bs)

{
  int iVar1;
  Int32 retVal;
  BitStream *bs_local;
  
  if (bs->mode == 'w') {
    while (bs->buffLive < 8) {
      bs->buffLive = bs->buffLive + 1;
      bs->buffer = bs->buffer << 1;
    }
    iVar1 = putc(bs->buffer & 0xff,(FILE *)bs->handle);
    if (iVar1 == -1) {
      writeError();
    }
    bytesOut = bytesOut + 1;
    iVar1 = fflush((FILE *)bs->handle);
    if (iVar1 == -1) {
      writeError();
    }
  }
  iVar1 = fclose((FILE *)bs->handle);
  if (iVar1 == -1) {
    if (bs->mode == 'w') {
      writeError();
    }
    else {
      readError();
    }
  }
  free(bs);
  return;
}

Assistant:

static void bsClose ( BitStream* bs )
{
   Int32 retVal;

   if ( bs->mode == 'w' ) {
      while ( bs->buffLive < 8 ) {
         bs->buffLive++;
         bs->buffer <<= 1;
      };
      retVal = putc ( (UChar) (bs->buffer), bs->handle );
      if (retVal == EOF) writeError();
      bytesOut++;
      retVal = fflush ( bs->handle );
      if (retVal == EOF) writeError();
   }
   retVal = fclose ( bs->handle );
   if (retVal == EOF) {
      if (bs->mode == 'w') writeError(); else readError();
   }
   free ( bs );
}